

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O0

char * testing::internal::ParseGoogleMockFlagValue(char *str,char *flag,bool def_optional)

{
  int iVar1;
  size_t __n;
  char *__s2;
  char *flag_end;
  size_t flag_len;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string flag_str;
  bool def_optional_local;
  char *flag_local;
  char *str_local;
  
  if ((str == (char *)0x0) || (flag == (char *)0x0)) {
    str_local = (char *)0x0;
  }
  else {
    flag_str.field_2._M_local_buf[0xf] = def_optional;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"--gmock_",&local_69);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                   &local_68,flag);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    __n = std::__cxx11::string::length();
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strncmp(str,__s2,__n);
    if (iVar1 == 0) {
      str_local = str + __n;
      if (((flag_str.field_2._M_local_buf[0xf] & 1U) == 0) || (*str_local != '\0')) {
        if (*str_local == '=') {
          str_local = str_local + 1;
        }
        else {
          str_local = (char *)0x0;
        }
      }
    }
    else {
      str_local = (char *)0x0;
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  return str_local;
}

Assistant:

static const char* ParseGoogleMockFlagValue(const char* str,
                                            const char* flag,
                                            bool def_optional) {
  // str and flag must not be NULL.
  if (str == nullptr || flag == nullptr) return nullptr;

  // The flag must start with "--gmock_".
  const std::string flag_str = std::string("--gmock_") + flag;
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return nullptr;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return nullptr;

  // Returns the string after "=".
  return flag_end + 1;
}